

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O1

ExprPtr __thiscall mathiu::impl::operator>(impl *this,ExprPtr *lhs,ExprPtr *rhs)

{
  long lVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  bool bVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  long *plVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  double dVar9;
  ExprPtr EVar10;
  undefined1 local_79;
  undefined8 local_78;
  undefined1 *local_70;
  _func_int **local_68;
  undefined1 *local_60;
  undefined4 local_58;
  double local_50;
  undefined1 local_48;
  undefined1 local_47 [7];
  ExprPtr *local_40;
  ExprPtr *local_38;
  
  bVar4 = equal(lhs,rhs);
  if (bVar4) {
    *(undefined8 *)this = false_;
    lVar1 = DAT_0025d688;
    *(long *)(this + 8) = DAT_0025d688;
    _Var7._M_pi = extraout_RDX;
    if (lVar1 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
      }
    }
  }
  else {
    local_68 = (_func_int **)local_47;
    local_78 = (_func_int **)((ulong)local_78._4_4_ << 0x20);
    local_70 = &local_79;
    local_60 = &local_48;
    local_40 = lhs;
    local_38 = rhs;
    bVar4 = std::operator()(&local_78,lhs,rhs);
    if (bVar4) {
      local_50 = evald(local_40);
      dVar9 = evald(local_38);
      plVar6 = &false_;
      if (dVar9 < local_50) {
        plVar6 = &true_;
      }
      _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_0025d688;
      if (dVar9 < local_50) {
        _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_0025d670;
      }
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar6;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (_Var7._M_pi)->_vptr__Sp_counted_base;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
    }
    else {
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Var7._M_pi = extraout_RDX_00;
    }
    p_Var5 = this_00;
    if (!bVar4) {
      std::
      _Tuple_impl<1UL,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
      ::_Tuple_impl((_Tuple_impl<1UL,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                     *)&local_78,lhs,rhs);
      local_58 = 3;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
      puVar3 = local_60;
      puVar2 = local_70;
      p_Var5->_M_use_count = 1;
      p_Var5->_M_weak_count = 1;
      p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00253718;
      p_Var8 = p_Var5 + 1;
      p_Var5[1]._vptr__Sp_counted_base = local_78;
      p_Var5[1]._M_use_count = 0;
      p_Var5[1]._M_weak_count = 0;
      local_70 = (undefined1 *)0x0;
      *(undefined1 **)&p_Var5[1]._M_use_count = puVar2;
      local_78 = (_func_int **)0x0;
      p_Var5[2]._vptr__Sp_counted_base = local_68;
      p_Var5[2]._M_use_count = 0;
      p_Var5[2]._M_weak_count = 0;
      local_60 = (undefined1 *)0x0;
      *(undefined1 **)&p_Var5[2]._M_use_count = puVar3;
      local_68 = (_func_int **)0x0;
      *(undefined4 *)&p_Var5[3]._vptr__Sp_counted_base = local_58;
      *(undefined1 *)&p_Var5[4]._M_use_count = 0xf;
      _Var7._M_pi = extraout_RDX_01;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        _Var7._M_pi = extraout_RDX_02;
      }
    }
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)this = p_Var8;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var5;
  }
  EVar10.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var7._M_pi;
  EVar10.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ExprPtr)EVar10.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr operator>(ExprPtr const &lhs, ExprPtr const &rhs)
    {
        if (equal(lhs, rhs))
        {
            return false_;
        }
        return match(lhs, rhs)(
            pattern | ds(asDouble, asDouble) = [&]
            { return evald(lhs) > evald(rhs) ? true_ : false_; },
            pattern | _ = [&]
            { return makeSharedExprPtr(Relational{RelationalKind::kGREATER, lhs, rhs}); });
    }